

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O2

void PVG_FT_Raster_Render(PVG_FT_Raster_Params *params)

{
  int iVar1;
  void *buffer;
  uint uVar2;
  size_t __size;
  TWorker worker;
  char stack [8192];
  TWorker_ TStack_3208;
  undefined1 local_2038 [8200];
  
  TStack_3208.skip_spans = 0;
  __size = 0x2000;
  iVar1 = gray_raster_render(&TStack_3208,local_2038,0x2000,params);
  uVar2 = 0;
  while (iVar1 == -6) {
    uVar2 = uVar2 - (TStack_3208.skip_spans >> 0x1f & TStack_3208.skip_spans);
    __size = __size * 2;
    TStack_3208.skip_spans = uVar2;
    buffer = malloc(__size);
    iVar1 = gray_raster_render(&TStack_3208,buffer,__size,params);
    free(buffer);
  }
  return;
}

Assistant:

void
  PVG_FT_Raster_Render(const PVG_FT_Raster_Params *params)
  {
      char stack[PVG_FT_MINIMUM_POOL_SIZE];
      size_t length = PVG_FT_MINIMUM_POOL_SIZE;

      TWorker worker;
      worker.skip_spans = 0;
      int rendered_spans = 0;
      int error = gray_raster_render(&worker, stack, length, params);
      while(error == ErrRaster_OutOfMemory) {
          if(worker.skip_spans < 0)
              rendered_spans += -worker.skip_spans;
          worker.skip_spans = rendered_spans;
          length *= 2;
          void* heap = malloc(length);
          error = gray_raster_render(&worker, heap, length, params);
          free(heap);
      }
  }